

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header_detection.cpp
# Opt level: O2

string * duckdb::TrimWhitespace(string *__return_storage_ptr__,string *col_name)

{
  utf8proc_uint8_t *puVar1;
  ulong uVar2;
  string *psVar3;
  utf8proc_category_t uVar4;
  long lVar5;
  utf8proc_ssize_t uVar6;
  unsigned_long uVar7;
  ulong uVar8;
  idx_t next;
  utf8proc_int32_t codepoint;
  utf8proc_int32_t local_4c;
  string *local_48;
  pointer local_40;
  string *local_38;
  
  local_40 = (col_name->_M_dataplus)._M_p;
  uVar2 = col_name->_M_string_length;
  local_48 = col_name;
  local_38 = __return_storage_ptr__;
  for (uVar8 = 0; uVar8 <= uVar2 && uVar2 - uVar8 != 0; uVar8 = uVar8 + uVar7) {
    puVar1 = (utf8proc_uint8_t *)(local_40 + uVar8);
    lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar2 - uVar8);
    uVar6 = utf8proc_iterate(puVar1,lVar5,&local_4c);
    uVar4 = utf8proc_category(local_4c);
    if (uVar4 != UTF8PROC_CATEGORY_ZS) break;
    uVar7 = NumericCastImpl<unsigned_long,_long,_false>::Convert(uVar6);
  }
  for (; psVar3 = local_38, uVar8 < local_48->_M_string_length; uVar8 = uVar8 + uVar7) {
    puVar1 = (utf8proc_uint8_t *)(local_40 + uVar8);
    lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar2 - uVar8);
    uVar6 = utf8proc_iterate(puVar1,lVar5,&local_4c);
    uVar7 = NumericCastImpl<unsigned_long,_long,_false>::Convert(uVar6);
    utf8proc_category(local_4c);
  }
  ::std::__cxx11::string::substr((ulong)local_38,(ulong)local_48);
  return psVar3;
}

Assistant:

static string TrimWhitespace(const string &col_name) {
	utf8proc_int32_t codepoint;
	const auto str = reinterpret_cast<const utf8proc_uint8_t *>(col_name.c_str());
	const idx_t size = col_name.size();
	// Find the first character that is not left trimmed
	idx_t begin = 0;
	while (begin < size) {
		auto bytes = utf8proc_iterate(str + begin, NumericCast<utf8proc_ssize_t>(size - begin), &codepoint);
		D_ASSERT(bytes > 0);
		if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
			break;
		}
		begin += NumericCast<idx_t>(bytes);
	}

	// Find the last character that is not right trimmed
	idx_t end = begin;
	for (auto next = begin; next < col_name.size();) {
		auto bytes = utf8proc_iterate(str + next, NumericCast<utf8proc_ssize_t>(size - next), &codepoint);
		D_ASSERT(bytes > 0);
		next += NumericCast<idx_t>(bytes);
		if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
			end = next;
		}
	}

	// return the trimmed string
	return col_name.substr(begin, end - begin);
}